

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# membrane-test.c++
# Opt level: O3

void __thiscall
capnp::_::anon_unknown_0::MembranePolicyImpl::~MembranePolicyImpl(MembranePolicyImpl *this)

{
  ForkHub<kj::_::Void> *pFVar1;
  Disposer *pDVar2;
  
  (this->super_MembranePolicy)._vptr_MembranePolicy = (_func_int **)&PTR_inboundCall_0060a8c0;
  (this->super_Refcounted).super_Disposer._vptr_Disposer = (_func_int **)&PTR_disposeImpl_0060a928;
  if (((this->revokePromise).ptr.isSet == true) &&
     (pFVar1 = (this->revokePromise).ptr.field_1.value.hub.ptr,
     pFVar1 != (ForkHub<kj::_::Void> *)0x0)) {
    (this->revokePromise).ptr.field_1.value.hub.ptr = (ForkHub<kj::_::Void> *)0x0;
    pDVar2 = (this->revokePromise).ptr.field_1.value.hub.disposer;
    (**pDVar2->_vptr_Disposer)
              (pDVar2,(_func_int *)
                      ((long)&(pFVar1->super_ForkHubBase).super_Refcounted.super_Disposer.
                              _vptr_Disposer +
                      (long)(pFVar1->super_ForkHubBase).super_Refcounted.super_Disposer.
                            _vptr_Disposer[-2]));
  }
  kj::Refcounted::~Refcounted(&this->super_Refcounted);
  operator_delete(this,0x30);
  return;
}

Assistant:

MembranePolicyImpl() = default;